

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

long CMprobe_latency(CMConnection conn,long msg_size,attr_list attrs)

{
  long lVar1;
  attr_list in_RSI;
  char *in_RDI;
  CManager_conflict cm;
  long ret;
  
  IntCManager_lock(cm,in_RDI,(int)((ulong)in_RSI >> 0x20));
  lVar1 = INT_CMprobe_latency((CMConnection)cm,(int)((ulong)in_RDI >> 0x20),in_RSI);
  IntCManager_unlock(cm,in_RDI,(int)((ulong)in_RSI >> 0x20));
  return lVar1;
}

Assistant:

extern long
CMprobe_latency ( CMConnection conn, long msg_size, attr_list attrs )
{
	long ret;
	CManager cm = conn->cm;
	CManager_lock(cm);
	ret = INT_CMprobe_latency(conn, msg_size, attrs);
	CManager_unlock(cm);
	return ret;
}